

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

double __thiscall iDynTree::Rotation::log(Rotation *this,double __x)

{
  double *dataPtr;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  AngleAxis<double> *in_RSI;
  double extraout_XMM0_Qa;
  AngularMotionVector3 *ret;
  AngleAxisd aa;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff48;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_ffffffffffffff60;
  StorageBaseType *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  AngleAxis<double> local_28;
  
  GeomVector3::GeomVector3((GeomVector3 *)0x6c7e1e);
  dataPtr = MatrixFixSize<3U,_3U>::data((MatrixFixSize<3U,_3U> *)in_RSI);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_RSI);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_ffffffffffffff60,dataPtr,(Stride<0,_0> *)in_RSI);
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            (in_RSI,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_ffffffffffffff48);
  this_00 = (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
            Eigen::AngleAxis<double>::angle(&local_28);
  Eigen::AngleAxis<double>::axis(&local_28);
  Eigen::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  VectorFixSize<3U>::data((VectorFixSize<3U> *)this);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_RSI);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_00,dataPtr,(Stride<0,_0> *)in_RSI);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
             in_stack_ffffffffffffff48);
  return extraout_XMM0_Qa;
}

Assistant:

AngularMotionVector3 Rotation::log() const
    {
        AngularMotionVector3 ret;

        Eigen::AngleAxisd aa(Eigen::Map<const Matrix3dRowMajor>(this->data()));

        // Implementation inspired from DART, see
        // https://github.com/dartsim/dart/pull/407/files
        // https://github.com/dartsim/dart/pull/334
        // https://github.com/dartsim/dart/issues/88
        Eigen::Map<Eigen::Vector3d>(ret.data()) = aa.angle()*aa.axis();

        return ret;
    }